

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizerValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)603>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  undefined8 interface_00;
  bool bVar1;
  int32 modelVersion;
  MapCase MVar2;
  CoreML *pCVar3;
  DictVectorizer *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator local_151;
  string local_150;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_12d;
  TypeCase local_12c;
  iterator local_128;
  size_type local_120;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_118;
  Result local_100;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d5;
  TypeCase local_d4;
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  Result local_a8;
  undefined4 local_80;
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    pCVar3 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)result.m_message.field_2._8_8_);
    local_d4 = kDictionaryType;
    local_d0 = &local_d4;
    local_c8 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d5);
    __l_00._M_len = local_c8;
    __l_00._M_array = local_d0;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c0,__l_00,&local_d5);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_a8,pCVar3,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_c0,in_R8);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c0);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d5);
    bVar1 = Result::good((Result *)local_48);
    if (bVar1) {
      pCVar3 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)result.m_message.field_2._8_8_);
      local_12c = kDictionaryType;
      local_128 = &local_12c;
      local_120 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_12d);
      __l._M_len = local_120;
      __l._M_array = local_128;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_118,__l,&local_12d);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_100,pCVar3,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_118,
                 in_R8);
      Result::operator=((Result *)local_48,&local_100);
      Result::~Result(&local_100);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_118);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_12d);
      bVar1 = Result::good((Result *)local_48);
      if (bVar1) {
        this = Specification::Model::dictvectorizer(format);
        MVar2 = Specification::DictVectorizer::Map_case(this);
        if (MVar2 == MAP_NOT_SET) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_150,"DictVectorizerValidator parameter not set",&local_151);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator((allocator<char> *)&local_151);
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  local_80 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_dictVectorizer>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kDictionaryType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kDictionaryType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        switch (format.dictvectorizer().Map_case()) {
            case Specification::DictVectorizer::kInt64ToIndex:
            case Specification::DictVectorizer::kStringToIndex:
                break;
            case Specification::DictVectorizer::MAP_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "DictVectorizerValidator parameter not set");
        }

        return result;
    }